

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png_io.cc
# Opt level: O0

void __thiscall
gimage::PNGImageIO::loadHeader(PNGImageIO *this,char *name,long *width,long *height,int *depth)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  undefined8 uVar5;
  string *message;
  __jmp_buf_tag *__env;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  ulong *in_RCX;
  ulong *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  long *in_RDI;
  undefined4 *in_R8;
  int color;
  png_infop end;
  png_infop info;
  png_structp png;
  FILE *in;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd88;
  string *in_stack_fffffffffffffdb8;
  IOException *in_stack_fffffffffffffdc0;
  allocator *this_00;
  allocator local_201;
  string local_200 [102];
  undefined1 local_19a;
  allocator local_199;
  string local_198 [32];
  long local_178;
  undefined1 local_16a;
  allocator local_169;
  string local_168 [32];
  long local_148;
  undefined1 local_13a;
  allocator local_139;
  string local_138 [32];
  long local_118;
  undefined1 local_10a;
  allocator local_109;
  string local_108 [96];
  FILE *local_a8;
  undefined1 local_9d;
  allocator local_89;
  string local_88 [96];
  undefined4 *local_28;
  ulong *local_20;
  ulong *local_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  uVar4 = (**(code **)(*in_RDI + 0x18))(in_RDI,in_RSI,1);
  if ((uVar4 & 1) == 0) {
    local_9d = 1;
    uVar5 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,(char *)local_10,&local_89);
    std::operator+((char *)in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
    std::operator+(in_stack_fffffffffffffd88,(char *)in_stack_fffffffffffffd80);
    gutil::IOException::IOException(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    local_9d = 0;
    __cxa_throw(uVar5,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
  }
  local_a8 = fopen((char *)local_10,"rb");
  if (local_a8 == (FILE *)0x0) {
    local_10a = 1;
    uVar5 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_108,(char *)local_10,&local_109);
    std::operator+((char *)in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
    std::operator+(in_stack_fffffffffffffd88,(char *)in_stack_fffffffffffffd80);
    gutil::IOException::IOException(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    local_10a = 0;
    __cxa_throw(uVar5,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
  }
  local_118 = png_create_read_struct("1.6.37",0,0);
  if (local_118 == 0) {
    fclose(local_a8);
    local_13a = 1;
    message = (string *)__cxa_allocate_exception(0x28);
    this_00 = &local_139;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_138,"Cannot allocate handle for reading PNG files",this_00);
    gutil::IOException::IOException((IOException *)this_00,message);
    local_13a = 0;
    __cxa_throw(message,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
  }
  local_148 = png_create_info_struct(local_118);
  if (local_148 == 0) {
    png_destroy_read_struct(&local_118,0);
    fclose(local_a8);
    local_16a = 1;
    uVar5 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_168,"Cannot allocate PNG info structure",&local_169);
    gutil::IOException::IOException(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    local_16a = 0;
    __cxa_throw(uVar5,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
  }
  local_178 = png_create_info_struct(local_118);
  if (local_178 == 0) {
    png_destroy_read_struct(&local_118,&local_148,0);
    fclose(local_a8);
    local_19a = 1;
    uVar5 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_198,"Cannot allocate PNG info structure",&local_199);
    gutil::IOException::IOException(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    local_19a = 0;
    __cxa_throw(uVar5,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
  }
  __env = (__jmp_buf_tag *)png_set_longjmp_fn(local_118,longjmp,200);
  iVar2 = _setjmp(__env);
  if (iVar2 != 0) {
    png_destroy_read_struct(&local_118,&local_148,&local_178);
    fclose(local_a8);
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_200,(char *)local_10,&local_201);
    std::operator+((char *)local_10,__rhs);
    std::operator+(local_10,(char *)__rhs);
    gutil::IOException::IOException(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    __cxa_throw(__rhs,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
  }
  png_init_io(local_118,local_a8);
  png_read_info(local_118,local_148);
  uVar3 = png_get_image_width(local_118,local_148);
  *local_18 = (ulong)uVar3;
  uVar3 = png_get_image_height(local_118,local_148);
  *local_20 = (ulong)uVar3;
  *local_28 = 1;
  cVar1 = png_get_color_type(local_118,local_148);
  if (((cVar1 == '\x03') || (cVar1 == '\x02')) || (cVar1 == '\x06')) {
    *local_28 = 3;
  }
  png_destroy_read_struct(&local_118,&local_148,&local_178);
  fclose(local_a8);
  return;
}

Assistant:

void PNGImageIO::loadHeader(const char *name, long &width, long &height,
                            int &depth) const
{
  if (!handlesFile(name, true))
  {
    throw gutil::IOException("Can only load PNG image ("+std::string(name)+")");
  }

  // initialize reading a png file

  FILE *in=fopen(name, "rb");

  if (in == 0)
  {
    throw gutil::IOException("Cannot open file ("+std::string(name)+")");
  }

  png_structp png=png_create_read_struct(PNG_LIBPNG_VER_STRING, 0, 0, 0);

  if (png == 0)
  {
    fclose(in);
    throw gutil::IOException("Cannot allocate handle for reading PNG files");
  }

  png_infop info=png_create_info_struct(png);

  if (info == 0)
  {
    png_destroy_read_struct(&png, static_cast<png_infopp>(0), static_cast<png_infopp>(0));
    fclose(in);
    throw gutil::IOException("Cannot allocate PNG info structure");
  }

  png_infop end=png_create_info_struct(png);

  if (end == 0)
  {
    png_destroy_read_struct(&png, &info, static_cast<png_infopp>(0));
    fclose(in);
    throw gutil::IOException("Cannot allocate PNG info structure");
  }

  if (setjmp(png_jmpbuf(png)))
  {
    png_destroy_read_struct(&png, &info, &end);
    fclose(in);
    throw gutil::IOException("Cannot read PNG file ("+std::string(name)+")");
  }

  // read header data

  png_init_io(png, in);
  png_read_info(png, info);

  width=static_cast<long>(png_get_image_width(png, info));
  height=static_cast<long>(png_get_image_height(png, info));

  depth=1;
  int color=png_get_color_type(png, info);

  if (color == PNG_COLOR_TYPE_PALETTE || color == PNG_COLOR_TYPE_RGB ||
      color == PNG_COLOR_TYPE_RGB_ALPHA)
  {
    depth=3;
  }

  // close data set

  png_destroy_read_struct(&png, &info, &end);
  fclose(in);
}